

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void Memory::HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  long lVar1;
  BlockInfoMapRow *paBVar2;
  ushort *puVar3;
  code *pcVar4;
  BlockInfo *pBVar5;
  bool bVar6;
  undefined4 *puVar7;
  long lVar8;
  ushort uVar9;
  int iVar10;
  ushort *puVar11;
  ulong uVar12;
  ulong uVar13;
  BVIndex i;
  uint uVar14;
  ulong uVar15;
  ushort *validInteriorPointers;
  int iVar16;
  ushort uVar17;
  ValidPointersMapTable *paauVar18;
  long local_50;
  ushort local_44;
  long local_40;
  uint local_34;
  
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0x3a000);
  }
  local_40 = 0x40;
  local_34 = 0x400;
  local_50 = 0x80;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar8 = 0;
  do {
    puVar11 = (*validTable)[0] + 0x800;
    if (validTable == (ValidPointersMapTable *)0x0) {
      puVar11 = (ushort *)0x0;
    }
    memset(*invalidTable + lVar8,0xff,0x100);
    lVar1 = lVar8 + 1;
    uVar12 = lVar1 * 0x100 + 0x300;
    paBVar2 = *blockInfoTable + lVar8;
    ((BlockInfo *)((long)paBVar2 + 0))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 4))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 4))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 8))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 8))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 0xc))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0xc))->pageObjectCount = 0;
    pBVar5 = (*blockInfoTable)[lVar8];
    pBVar5[4].lastObjectIndexOnPage = 0;
    pBVar5[4].pageObjectCount = 0;
    pBVar5[5].lastObjectIndexOnPage = 0;
    pBVar5[5].pageObjectCount = 0;
    pBVar5[6].lastObjectIndexOnPage = 0;
    pBVar5[6].pageObjectCount = 0;
    pBVar5[7].lastObjectIndexOnPage = 0;
    pBVar5[7].pageObjectCount = 0;
    i = 0;
    uVar13 = 0;
    uVar17 = 0;
    paauVar18 = validTable;
    do {
      if (validTable != (ValidPointersMapTable *)0x0) {
        (*paauVar18)[0][0] = uVar17;
      }
      if (0xfffefff < (uint)uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                           ,0xaa,"(objectAddress / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                           "objectAddress / AutoSystemInfo::PageSize < USHRT_MAX");
        if (!bVar6) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      uVar15 = uVar13 >> 0xc & 0xffff;
      puVar3 = &(*blockInfoTable)[lVar8][uVar15].pageObjectCount;
      *puVar3 = *puVar3 + 1;
      uVar9 = (*blockInfoTable)[lVar8][uVar15].lastObjectIndexOnPage;
      if (uVar9 < uVar17) {
        uVar9 = uVar17;
      }
      (*blockInfoTable)[lVar8][uVar15].lastObjectIndexOnPage = uVar9;
      BVStatic<2048UL>::Clear(*invalidTable + lVar8,i);
      uVar17 = uVar17 + 1;
      paauVar18 = (ValidPointersMapTable *)((long)(*paauVar18)[0] + local_50);
      uVar13 = (ulong)((uint)uVar13 + local_34);
      i = i + (int)local_40;
      local_44 = (ushort)(0x8000 / (uVar12 & 0xffffffff));
    } while (uVar17 < local_44);
    if (puVar11 == (ushort *)0x0) {
      validTable = (ValidPointersMapTable *)0x0;
    }
    else {
      validTable = (ValidPointersMapTable *)(puVar11 + 0x800);
      iVar10 = 0;
      uVar13 = 0;
      do {
        iVar16 = (int)(uVar12 >> 4);
        uVar14 = iVar10 * iVar16;
        if (uVar14 < 0x800) {
          uVar14 = uVar14 + iVar16;
          if (0x7ff < uVar14) {
            uVar14 = 0x800;
          }
          uVar15 = uVar13;
          do {
            puVar11[uVar15] = (ushort)iVar10;
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar14);
        }
        iVar10 = iVar10 + 1;
        uVar13 = uVar13 + local_40;
      } while (iVar10 != (int)(0x8000 / (ulong)local_34));
    }
    local_40 = local_40 + 0x10;
    local_34 = local_34 + 0x100;
    local_50 = local_50 + 0x20;
    lVar8 = lVar1;
  } while (lVar1 != 0x1d);
  return;
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}